

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O0

IO __thiscall adios2::ADIOS::DeclareIO(ADIOS *this,string *name,ArrayOrdering ArrayOrder)

{
  element_type *peVar1;
  IO *io;
  undefined4 in_EDX;
  string *in_RSI;
  char *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string *this_00;
  string local_90 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff98;
  ADIOS *in_stack_ffffffffffffffa0;
  string local_40 [36];
  undefined4 local_1c;
  IO local_8;
  
  local_1c = in_EDX;
  std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  CheckPointer(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  peVar1 = std::__shared_ptr_access<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x285c1b);
  this_00 = local_90;
  std::__cxx11::string::string(this_00,in_RSI);
  io = (IO *)adios2::core::ADIOS::DeclareIO(peVar1,this_00,local_1c);
  IO::IO(&local_8,io);
  std::__cxx11::string::~string(local_90);
  return (IO)local_8.m_IO;
}

Assistant:

IO ADIOS::DeclareIO(const std::string name, const ArrayOrdering ArrayOrder)
{
    CheckPointer("for io name " + name + ", in call to ADIOS::DeclareIO");
    return IO(&m_ADIOS->DeclareIO(name, ArrayOrder));
}